

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

void __thiscall cfd::core::DescriptorNode::AnalyzeScriptTree(DescriptorNode *this)

{
  string *psVar1;
  byte bVar2;
  ulong uVar3;
  CfdException *this_00;
  ulong uVar4;
  uint32_t script_depth;
  string tapscript;
  string temp_name;
  DescriptorNode node;
  uint local_224;
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *local_1c0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
  *local_1b8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_1b0;
  undefined1 *local_1a8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [7];
  uint32_t local_88;
  DescriptorNodeType local_80;
  undefined1 local_58 [8];
  char *local_50;
  
  local_224 = 0;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  if ((this->value_)._M_string_length == 0) {
    if ((this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00333613:
      local_1a0._0_8_ = "cfdcore_descriptor.cpp";
      local_1a0._8_4_ = 0x64e;
      local_190._M_allocated_capacity = 0x61282b;
      logger::log<>((CfdSourceLocation *)local_1a0,kCfdLogLevelWarning,
                    "Failed to taproot. empty script.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1a0._0_8_ = &local_190;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Failed to taproot. empty script.","");
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_1a0);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    psVar1 = &this->value_;
    local_1b0 = &this->addr_prefixes_;
    local_1a8 = local_58;
    local_1b8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
                 *)&this->tree_node_;
    local_1c0 = (vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>> *)
                &this->child_node_;
    uVar4 = 0;
    do {
      bVar2 = (psVar1->_M_dataplus)._M_p[uVar4];
      if (bVar2 < 0x2c) {
        if (bVar2 != 0x20) {
          if (bVar2 == 0x28) {
            if (local_224 == 0) {
              ::std::__cxx11::string::substr((ulong)local_1a0,(ulong)psVar1);
              ::std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_1a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._0_8_ != &local_190) {
                operator_delete((void *)local_1a0._0_8_,(ulong)(local_190._M_allocated_capacity + 1)
                               );
              }
            }
            local_1a0._0_8_ = "cfdcore_descriptor.cpp";
            local_1a0._8_4_ = 0x61a;
            local_190._M_allocated_capacity = 0x61282b;
            logger::log<unsigned_int&,std::__cxx11::string&>
                      ((CfdSourceLocation *)local_1a0,kCfdLogLevelInfo,
                       "Target`(` script_depth={}, name={}",&local_224,&local_1e0);
            local_224 = local_224 + 1;
          }
          else if (bVar2 == 0x29) {
            local_224 = local_224 - 1;
            local_1a0._0_8_ = "cfdcore_descriptor.cpp";
            local_1a0._8_4_ = 0x61f;
            local_190._M_allocated_capacity = 0x61282b;
            logger::log<unsigned_int&>
                      ((CfdSourceLocation *)local_1a0,kCfdLogLevelInfo,"Target`)` script_depth = {}"
                       ,&local_224);
            if (local_224 == 0) {
              ::std::__cxx11::string::substr((ulong)local_1a0,(ulong)psVar1);
              ::std::__cxx11::string::operator=((string *)&local_200,(string *)local_1a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._0_8_ != &local_190) {
                operator_delete((void *)local_1a0._0_8_,(ulong)(local_190._M_allocated_capacity + 1)
                               );
              }
              DescriptorNode((DescriptorNode *)local_1a0,local_1b0,this->network_type_);
              ::std::__cxx11::string::_M_assign((string *)local_1a0);
              local_80 = kDescriptorTypeScript;
              ::std::__cxx11::string::_M_assign((string *)local_180);
              local_88 = 1;
              ::std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_50,0x586ea8);
              if ((char *)local_1e0._M_string_length != (char *)0x0) {
                AnalyzeChild((DescriptorNode *)local_1a0,&local_200,2);
              }
              local_220._0_8_ = &local_210;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"tr","");
              AnalyzeAll((DescriptorNode *)local_1a0,(string *)local_220);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._0_8_ != &local_210) {
                operator_delete((void *)local_220._0_8_,(ulong)(local_210._M_allocated_capacity + 1)
                               );
              }
              ::std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
              ::_M_emplace_unique<std::__cxx11::string&,cfd::core::DescriptorNode&>
                        (local_1b8,&local_200,(DescriptorNode *)local_1a0);
              ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
              emplace_back<cfd::core::DescriptorNode&>(local_1c0,(DescriptorNode *)local_1a0);
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_200,0,(char *)local_200._M_string_length,0x75474e);
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_1e0,0,(char *)local_1e0._M_string_length,0x75474e);
              local_220._0_8_ = "cfdcore_descriptor.cpp";
              local_220._8_4_ = 0x633;
              local_210._M_allocated_capacity = 0x61282b;
              logger::log<unsigned_int&,std::__cxx11::string&>
                        ((CfdSourceLocation *)local_220,kCfdLogLevelInfo,
                         "Target`)` script_depth={}, child.value={}",&local_224,local_180);
              ~DescriptorNode((DescriptorNode *)local_1a0);
            }
          }
        }
      }
      else if (((bVar2 == 0x2c) || (bVar2 == 0x7d)) && (local_224 == 0)) {
        ::std::__cxx11::string::substr((ulong)local_1a0,(ulong)psVar1);
        ::std::__cxx11::string::operator=((string *)&local_200,(string *)local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._0_8_ != &local_190) {
          operator_delete((void *)local_1a0._0_8_,(ulong)(local_190._M_allocated_capacity + 1));
        }
        if ((char *)0x3f < local_200._M_string_length) {
          DescriptorNode((DescriptorNode *)local_1a0,local_1b0,this->network_type_);
          ::std::__cxx11::string::_M_assign((string *)local_1a0);
          local_80 = kDescriptorTypeKey;
          ::std::__cxx11::string::_M_assign((string *)local_180);
          local_88 = 1;
          ::std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_50,0x586ea8);
          if ((char *)local_1e0._M_string_length != (char *)0x0) {
            AnalyzeChild((DescriptorNode *)local_1a0,&local_200,2);
          }
          local_220._0_8_ = &local_210;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"tr","");
          AnalyzeAll((DescriptorNode *)local_1a0,(string *)local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._0_8_ != &local_210) {
            operator_delete((void *)local_220._0_8_,(ulong)(local_210._M_allocated_capacity + 1));
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
          ::_M_emplace_unique<std::__cxx11::string&,cfd::core::DescriptorNode&>
                    (local_1b8,&local_200,(DescriptorNode *)local_1a0);
          ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
          emplace_back<cfd::core::DescriptorNode&>(local_1c0,(DescriptorNode *)local_1a0);
          ::std::__cxx11::string::_M_replace
                    ((ulong)&local_200,0,(char *)local_200._M_string_length,0x75474e);
          ::std::__cxx11::string::_M_replace
                    ((ulong)&local_1e0,0,(char *)local_1e0._M_string_length,0x75474e);
          local_220._0_8_ = "cfdcore_descriptor.cpp";
          local_220._8_4_ = 0x60e;
          local_210._M_allocated_capacity = 0x61282b;
          logger::log<unsigned_int&,std::__cxx11::string&>
                    ((CfdSourceLocation *)local_220,kCfdLogLevelInfo,
                     "HashTarget script_depth={}, child.value={}",&local_224,local_180);
          ~DescriptorNode((DescriptorNode *)local_1a0);
        }
      }
      uVar4 = uVar4 + 1;
      uVar3 = (this->value_)._M_string_length;
    } while (uVar4 < uVar3);
    if ((this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      if (uVar3 < 0x40) goto LAB_00333613;
      ::std::__cxx11::string::_M_assign((string *)&local_200);
      DescriptorNode((DescriptorNode *)local_1a0,local_1b0,this->network_type_);
      ::std::__cxx11::string::_M_assign((string *)local_1a0);
      local_80 = kDescriptorTypeKey;
      ::std::__cxx11::string::_M_assign((string *)local_180);
      local_88 = 1;
      ::std::__cxx11::string::_M_replace((ulong)local_58,0,local_50,0x586ea8);
      if ((char *)local_1e0._M_string_length != (char *)0x0) {
        AnalyzeChild((DescriptorNode *)local_1a0,&local_200,2);
      }
      local_220._0_8_ = &local_210;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"tr","");
      AnalyzeAll((DescriptorNode *)local_1a0,(string *)local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._0_8_ != &local_210) {
        operator_delete((void *)local_220._0_8_,(ulong)(local_210._M_allocated_capacity + 1));
      }
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::DescriptorNode>>>
      ::_M_emplace_unique<std::__cxx11::string&,cfd::core::DescriptorNode&>
                (local_1b8,&local_200,(DescriptorNode *)local_1a0);
      ::std::vector<cfd::core::DescriptorNode,std::allocator<cfd::core::DescriptorNode>>::
      emplace_back<cfd::core::DescriptorNode&>(local_1c0,(DescriptorNode *)local_1a0);
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_200,0,(char *)local_200._M_string_length,0x75474e);
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_1e0,0,(char *)local_1e0._M_string_length,0x75474e);
      local_220._0_8_ = "cfdcore_descriptor.cpp";
      local_220._8_4_ = 0x64b;
      local_210._M_allocated_capacity = 0x61282b;
      logger::log<unsigned_int&,std::__cxx11::string&>
                ((CfdSourceLocation *)local_220,kCfdLogLevelInfo,
                 "LastTarget script_depth={}, child.value={}",&local_224,local_180);
      ~DescriptorNode((DescriptorNode *)local_1a0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,
                    CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                             local_200.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void DescriptorNode::AnalyzeScriptTree() {
  const auto& desc = value_;

  uint32_t script_depth = 0;
  size_t offset = 0;
  std::string tapscript;
  uint32_t tapleaf_count = 0;
  std::string temp_name;
  for (size_t idx = 0; idx < desc.size(); ++idx) {
    const char& str = desc[idx];
    if ((str == ' ') || (str == '{')) {
      if (script_depth == 0) ++offset;
    } else if ((str == ',') || (str == '}')) {
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset);
        if (tapscript.length() >= (kByteData256Length * 2)) {
          offset = idx + 1;
          DescriptorNode node(addr_prefixes_, network_type_);
          node.name_ = temp_name;
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
          node.value_ = tapscript;
          node.depth_ = 1;
          node.parent_kind_ = "tr";
          if (!temp_name.empty()) {
            node.AnalyzeChild(tapscript, 2);
          }
          node.AnalyzeAll("tr");
          tree_node_.emplace(tapscript, node);
          child_node_.emplace_back(node);
          ++tapleaf_count;
          tapscript = "";
          temp_name = "";
          info(
              CFD_LOG_SOURCE, "HashTarget script_depth={}, child.value={}",
              script_depth, node.value_);
        } else {
          ++offset;
        }
      }
    } else if (str == '(') {
      if (script_depth == 0) {
        temp_name = desc.substr(offset, idx - offset);
        // offset = idx + 1;
      }
      info(
          CFD_LOG_SOURCE, "Target`(` script_depth={}, name={}", script_depth,
          temp_name);
      ++script_depth;
    } else if (str == ')') {
      --script_depth;
      info(CFD_LOG_SOURCE, "Target`)` script_depth = {}", script_depth);
      if (script_depth == 0) {
        tapscript = desc.substr(offset, idx - offset + 1);
        offset = idx + 1;
        DescriptorNode node(addr_prefixes_, network_type_);
        node.name_ = temp_name;
        node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
        node.value_ = tapscript;
        node.depth_ = 1;
        node.parent_kind_ = "tr";
        if (!temp_name.empty()) {
          node.AnalyzeChild(tapscript, 2);
        }
        node.AnalyzeAll("tr");
        tree_node_.emplace(tapscript, node);
        child_node_.emplace_back(node);
        ++tapleaf_count;
        tapscript = "";
        temp_name = "";
        info(
            CFD_LOG_SOURCE, "Target`)` script_depth={}, child.value={}",
            script_depth, node.value_);
      }
    }
  }
  if (tree_node_.empty()) {
    if (value_.length() >= (kByteData256Length * 2)) {
      tapscript = value_;
      DescriptorNode node(addr_prefixes_, network_type_);
      node.name_ = temp_name;
      node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
      node.value_ = tapscript;
      node.depth_ = 1;
      node.parent_kind_ = "tr";
      if (!temp_name.empty()) {
        node.AnalyzeChild(tapscript, 2);
      }
      node.AnalyzeAll("tr");
      tree_node_.emplace(tapscript, node);
      child_node_.emplace_back(node);
      ++tapleaf_count;
      tapscript = "";
      temp_name = "";
      info(
          CFD_LOG_SOURCE, "LastTarget script_depth={}, child.value={}",
          script_depth, node.value_);
    } else {
      warn(CFD_LOG_SOURCE, "Failed to taproot. empty script.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot. empty script.");
    }
  }
}